

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O2

void __thiscall
duckdb::Blob::FromBase64(Blob *this,string_t str,data_ptr_t output,idx_t output_size)

{
  uint32_t uVar1;
  long lVar2;
  idx_t base_idx;
  data_ptr_t pdVar3;
  char *input_data;
  string_t str_local;
  
  lVar2 = str.value._8_8_;
  str_local.value.pointer.ptr = (char *)str.value._0_8_;
  input_data = str_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    input_data = str_local.value.pointer.prefix;
  }
  if ((uint)this != 0) {
    pdVar3 = (data_ptr_t)0x1;
    base_idx = 0;
    str_local.value._0_8_ = this;
    while (base_idx + 4 < ((ulong)this & 0xffffffff)) {
      uVar1 = DecodeBase64Bytes<false>(&str_local,(const_data_ptr_t)input_data,base_idx);
      pdVar3[lVar2 + -1] = (data_t)(uVar1 >> 0x10);
      pdVar3[lVar2] = (data_t)(uVar1 >> 8);
      pdVar3[lVar2 + 1] = (data_t)uVar1;
      pdVar3 = pdVar3 + 3;
      base_idx = base_idx + 4;
    }
    uVar1 = DecodeBase64Bytes<true>(&str_local,(const_data_ptr_t)input_data,base_idx);
    pdVar3[lVar2 + -1] = (data_t)(uVar1 >> 0x10);
    if (pdVar3 < output) {
      pdVar3[lVar2] = (data_t)(uVar1 >> 8);
      pdVar3 = pdVar3 + 1;
    }
    if (pdVar3 < output) {
      pdVar3[lVar2] = (data_t)uVar1;
    }
  }
  return;
}

Assistant:

void Blob::FromBase64(string_t str, data_ptr_t output, idx_t output_size) {
	D_ASSERT(output_size == FromBase64Size(str));
	auto input_data = const_data_ptr_cast(str.GetData());
	auto input_size = str.GetSize();
	if (input_size == 0) {
		return;
	}
	idx_t out_idx = 0;
	idx_t i = 0;
	for (i = 0; i + 4 < input_size; i += 4) {
		auto combined = DecodeBase64Bytes<false>(str, input_data, i);
		output[out_idx++] = (combined >> 2 * 8) & 0xFF;
		output[out_idx++] = (combined >> 1 * 8) & 0xFF;
		output[out_idx++] = (combined >> 0 * 8) & 0xFF;
	}
	// decode the final four bytes: padding is allowed here
	auto combined = DecodeBase64Bytes<true>(str, input_data, i);
	output[out_idx++] = (combined >> 2 * 8) & 0xFF;
	if (out_idx < output_size) {
		output[out_idx++] = (combined >> 1 * 8) & 0xFF;
	}
	if (out_idx < output_size) {
		output[out_idx++] = (combined >> 0 * 8) & 0xFF;
	}
}